

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::RALocalAllocator::spillAfterAllocation(RALocalAllocator *this,InstNode *node)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  Error EVar4;
  RATiedReg *pRVar5;
  RAWorkReg **ppRVar6;
  long in_RSI;
  long in_RDI;
  Error _err;
  uint32_t assignedId;
  RegGroup group;
  RAWorkReg *workReg;
  uint32_t workId;
  RATiedReg *tiedReg;
  uint32_t i;
  uint32_t count;
  RAInst *raInst;
  uint32_t in_stack_ffffffffffffff30;
  uint32_t in_stack_ffffffffffffff34;
  uint32_t in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  uint local_a8;
  
  uVar1 = *(uint *)(*(long *)(in_RSI + 0x20) + 0x10);
  local_a8 = 0;
  do {
    if (uVar1 <= local_a8) {
      return 0;
    }
    pRVar5 = RAInst::tiedAt((RAInst *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                            in_stack_ffffffffffffff34);
    bVar3 = Support::test<asmjit::v1_14::RATiedFlags,asmjit::v1_14::RATiedFlags>
                      (pRVar5->_flags,kLast);
    if (bVar3) {
      ppRVar6 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                          ((ZoneVector<asmjit::v1_14::RAWorkReg_*> *)
                           CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                           CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      if ((*ppRVar6)[0x4a] == (RAWorkReg)0xff) {
        uVar2 = CONCAT13((char)((uint)*(undefined4 *)(*ppRVar6 + 0x20) >> 8),
                         (int3)in_stack_ffffffffffffff3c);
        in_stack_ffffffffffffff3c = uVar2 & 0xfffffff;
        in_stack_ffffffffffffff38 =
             RAAssignment::workToPhysId
                       ((RAAssignment *)
                        (CONCAT44(uVar2,in_stack_ffffffffffffff38) & 0xfffffffffffffff),
                        (RegGroup)(in_stack_ffffffffffffff34 >> 0x18),in_stack_ffffffffffffff30);
        if (in_stack_ffffffffffffff38 != 0xff) {
          *(long *)(*(long *)(in_RDI + 8) + 0x198) = in_RSI;
          EVar4 = onSpillReg((RALocalAllocator *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                             (RegGroup)(in_stack_ffffffffffffff34 >> 0x18),in_stack_ffffffffffffff30
                             ,(uint32_t)((ulong)in_RDI >> 0x20));
          if (EVar4 != 0) {
            return EVar4;
          }
          in_stack_ffffffffffffff34 = 0;
        }
      }
    }
    local_a8 = local_a8 + 1;
  } while( true );
}

Assistant:

Error RALocalAllocator::spillAfterAllocation(InstNode* node) noexcept {
  // This is experimental feature that would spill registers that don't have home-id and are last in this basic block.
  // This prevents saving these regs in other basic blocks and then restoring them (mostly relevant for loops).
  RAInst* raInst = node->passData<RAInst>();
  uint32_t count = raInst->tiedCount();

  for (uint32_t i = 0; i < count; i++) {
    RATiedReg* tiedReg = raInst->tiedAt(i);
    if (tiedReg->isLast()) {
      uint32_t workId = tiedReg->workId();
      RAWorkReg* workReg = workRegById(workId);
      if (!workReg->hasHomeRegId()) {
        RegGroup group = workReg->group();
        uint32_t assignedId = _curAssignment.workToPhysId(group, workId);
        if (assignedId != RAAssignment::kPhysNone) {
          _cc->_setCursor(node);
          ASMJIT_PROPAGATE(onSpillReg(group, workId, assignedId));
        }
      }
    }
  }

  return kErrorOk;
}